

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall kj::FiberPool::~FiberPool(FiberPool *this)

{
  Impl *pIVar1;
  Disposer *pDVar2;
  
  pIVar1 = (this->impl).ptr;
  if (pIVar1 != (Impl *)0x0) {
    (this->impl).ptr = (Impl *)0x0;
    pDVar2 = (this->impl).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pIVar1->super_Disposer)._vptr_Disposer[-2] +
                      (long)&(pIVar1->super_Disposer)._vptr_Disposer);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }